

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

Float __thiscall pbrt::Triangle::PDF(Triangle *this,ShapeSampleContext *ctx,Vector3f *wi)

{
  Normal3f *n;
  Vector3<float> *v;
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  long lVar4;
  float fVar5;
  int iVar6;
  ShapeIntersection *pSVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  Float FVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar30 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar27 [64];
  undefined1 extraout_var_05 [56];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  float fVar31;
  undefined1 auVar32 [32];
  Point3f PVar33;
  Vector3<float> VVar34;
  span<const_float> w;
  initializer_list<pbrt::Point3<float>_> v_00;
  initializer_list<float> v_01;
  float local_238;
  Tuple3<pbrt::Vector3,_float> local_228;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  Tuple3<pbrt::Point3,_float> local_1f8;
  undefined4 local_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  Ray ray;
  Tuple3<pbrt::Point3,_float> local_148;
  optional<pbrt::ShapeIntersection> isect;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [56];
  
  auVar30 = in_ZMM0._8_56_;
  PVar33 = ShapeSampleContext::p(ctx);
  isect.optionalValue._8_4_ = PVar33.super_Tuple3<pbrt::Point3,_float>.z;
  auVar16._0_8_ = PVar33.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar16._8_56_ = auVar30;
  isect.optionalValue.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar16._0_16_);
  FVar13 = SolidAngle(this,(Point3f *)&isect);
  if ((FVar13 < 0.0002) || (6.22 < FVar13)) {
    ShapeSampleContext::SpawnRay(&ray,ctx,wi);
    Intersect(&isect,this,&ray,INFINITY);
    if ((PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg == '\0') &&
       (iVar6 = __cxa_guard_acquire(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)
                                     ::reg), iVar6 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg,
                 const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0)
      ;
      __cxa_guard_release(&PDF(pbrt::ShapeSampleContext_const&,pbrt::Vector3<float>const&)::reg);
    }
    *(long *)(in_FS_OFFSET + -0xe8) = *(long *)(in_FS_OFFSET + -0xe8) + 1;
    if (isect.set == false) {
      *(long *)(in_FS_OFFSET + -0xf0) = *(long *)(in_FS_OFFSET + -0xf0) + 1;
      local_238 = 0.0;
    }
    else {
      FVar13 = Area(this);
      auVar30 = extraout_var_04;
      pSVar7 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
      VVar34 = Tuple3<pbrt::Vector3,_float>::operator-(&wi->super_Tuple3<pbrt::Vector3,_float>);
      local_1f8.z = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar27._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar27._8_56_ = auVar30;
      local_1f8._0_8_ = vmovlps_avx(auVar27._0_16_);
      local_218._0_4_ =
           AbsDot<float>(&(pSVar7->intr).super_Interaction.n,(Vector3<float> *)&local_1f8);
      auVar30 = extraout_var_05;
      PVar33 = ShapeSampleContext::p(ctx);
      local_228.z = PVar33.super_Tuple3<pbrt::Point3,_float>.z;
      auVar28._0_8_ = PVar33.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar28._8_56_ = auVar30;
      local_228._0_8_ = vmovlps_avx(auVar28._0_16_);
      pSVar7 = pstd::optional<pbrt::ShapeIntersection>::value(&isect);
      PVar33 = Interaction::p((Interaction *)pSVar7);
      local_148.z = PVar33.super_Tuple3<pbrt::Point3,_float>.z;
      auVar29._0_8_ = PVar33.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar29._8_56_ = auVar30;
      local_148._0_8_ = vmovlps_avx(auVar29._0_16_);
      fVar14 = DistanceSquared<float>((Point3<float> *)&local_228,(Point3<float> *)&local_148);
      local_238 = (1.0 / FVar13) / ((float)local_218._0_4_ / fVar14);
      local_238 = (float)((uint)(ABS(local_238) != INFINITY) * (int)local_238);
    }
    pstd::optional<pbrt::ShapeIntersection>::~optional(&isect);
  }
  else {
    local_238 = 1.0 / FVar13;
    if (((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
         (fVar14 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y, fVar14 != 0.0)) || (NAN(fVar14)))
       || ((fVar14 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z, fVar14 != 0.0 || (NAN(fVar14)))
          )) {
      n = &ctx->ns;
      lVar4 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
      lVar9 = *(long *)(lVar4 + 8);
      lVar8 = (long)this->triIndex * 0xc;
      lVar4 = *(long *)(lVar4 + 0x10);
      lVar10 = (long)*(int *)(lVar9 + lVar8) * 0xc;
      local_1e8._8_8_ = 0;
      local_1e8._0_8_ = *(ulong *)(lVar4 + 4 + lVar10);
      lVar11 = (long)*(int *)(lVar9 + 4 + lVar8) * 0xc;
      lVar9 = (long)*(int *)(lVar9 + 8 + lVar8) * 0xc;
      local_1d8 = vmovshdup_avx(local_1e8);
      uVar1 = *(ulong *)(lVar4 + 4 + lVar11);
      local_1c8._8_8_ = 0;
      local_1c8._0_8_ = uVar1;
      uVar2 = *(ulong *)(lVar4 + lVar9);
      local_198._8_8_ = 0;
      local_198._0_8_ = uVar2;
      fVar14 = *(float *)(lVar4 + 8 + lVar9);
      local_208 = ZEXT416(*(uint *)(lVar4 + lVar10));
      local_1b8 = ZEXT416(*(uint *)(lVar4 + lVar11));
      auVar12 = vpermi2ps_avx512vl(_DAT_028b3040,local_1e8,local_208);
      local_1a8 = vmovshdup_avx(local_1c8);
      auVar12 = vinsertps_avx(auVar12,local_1b8,0x30);
      auVar32._16_8_ = uVar1;
      auVar32._0_16_ = auVar12;
      auVar32._24_8_ = 0;
      auVar15._16_8_ = uVar2;
      auVar15._0_16_ = auVar12;
      auVar15._24_8_ = 0;
      ray._0_32_ = vshufpd_avx(auVar32,auVar15,2);
      auVar30 = ZEXT856(ray._8_8_);
      v_00._M_len = 3;
      v_00._M_array = &ray.o;
      ray.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits._0_4_ = fVar14;
      pstd::array<pbrt::Point3<float>,_3>::array((array<pbrt::Point3<float>,_3> *)&isect,v_00);
      PVar33 = ShapeSampleContext::p(ctx);
      local_1f8.z = PVar33.super_Tuple3<pbrt::Point3,_float>.z;
      auVar17._0_8_ = PVar33.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar17._8_56_ = auVar30;
      local_1f8._0_8_ = vmovlpd_avx(auVar17._0_16_);
      auVar18._0_8_ =
           InvertSphericalTriangleSample
                     ((array<pbrt::Point3<float>,_3> *)&isect,(Point3f *)&local_1f8,wi);
      auVar18._8_56_ = extraout_var_03;
      local_188 = auVar18._0_16_;
      auVar30 = extraout_var_03;
      PVar33 = ShapeSampleContext::p(ctx);
      fVar31 = PVar33.super_Tuple3<pbrt::Point3,_float>.z;
      auVar19._0_8_ = PVar33.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar19._8_56_ = auVar30;
      local_218 = auVar19._0_16_;
      fVar5 = (float)local_208._0_4_ - PVar33.super_Tuple3<pbrt::Point3,_float>.x;
      local_208 = vmovshdup_avx(local_218);
      auVar12 = vinsertps_avx(ZEXT416((uint)fVar5),
                              ZEXT416((uint)((float)local_1e8._0_4_ - local_208._0_4_)),0x10);
      auVar30 = ZEXT856(auVar12._8_8_);
      uVar3 = vmovlps_avx(auVar12);
      ray.o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_1d8._0_4_ - fVar31;
      ray.o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
      ray.o.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
      VVar34 = Normalize<float>((Vector3<float> *)&ray);
      isect.optionalValue._8_4_ = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar20._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar30;
      isect.optionalValue.__align =
           (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar20._0_16_);
      v = (Vector3<float> *)((long)&isect.optionalValue + 0xc);
      auVar12 = vinsertps_avx(ZEXT416((uint)((float)local_1b8._0_4_ - (float)local_218._0_4_)),
                              ZEXT416((uint)((float)local_1c8._0_4_ - (float)local_208._0_4_)),0x10)
      ;
      auVar30 = ZEXT856(auVar12._8_8_);
      local_1f8.z = (float)local_1a8._0_4_ - fVar31;
      local_1f8._0_8_ = vmovlps_avx(auVar12);
      VVar34 = Normalize<float>((Vector3<float> *)&local_1f8);
      isect.optionalValue._20_4_ = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar21._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar21._8_56_ = auVar30;
      isect.optionalValue._12_8_ = vmovlps_avx(auVar21._0_16_);
      auVar12 = vsubps_avx(local_198,local_218);
      auVar30 = ZEXT856(auVar12._8_8_);
      local_228.z = fVar14 - fVar31;
      local_228._0_8_ = vmovlps_avx(auVar12);
      VVar34 = Normalize<float>((Vector3<float> *)&local_228);
      isect.optionalValue._32_4_ = VVar34.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar22._0_8_ = VVar34.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar22._8_56_ = auVar30;
      isect.optionalValue._24_8_ = vmovlps_avx(auVar22._0_16_);
      auVar23._0_4_ = AbsDot<float>(n,v);
      auVar23._4_60_ = extraout_var;
      auVar12 = vmaxss_avx(auVar23._0_16_,ZEXT416(0x3c23d70a));
      local_1f8.x = auVar12._0_4_;
      auVar24._0_4_ = AbsDot<float>(n,v);
      auVar24._4_60_ = extraout_var_00;
      auVar12 = vmaxss_avx(auVar24._0_16_,ZEXT416(0x3c23d70a));
      local_1f8.y = auVar12._0_4_;
      auVar25._0_4_ = AbsDot<float>(n,(Vector3<float> *)&isect);
      auVar25._4_60_ = extraout_var_01;
      auVar12 = vmaxss_avx(auVar25._0_16_,ZEXT416(0x3c23d70a));
      local_1f8.z = auVar12._0_4_;
      auVar26._0_4_ = AbsDot<float>(n,(Vector3<float> *)((long)&isect.optionalValue + 0x18));
      auVar26._4_60_ = extraout_var_02;
      auVar12 = vmaxss_avx(auVar26._0_16_,ZEXT416(0x3c23d70a));
      local_1ec = auVar12._0_4_;
      v_01._M_len = 4;
      v_01._M_array = &local_1f8.x;
      pstd::array<float,_4>::array((array<float,_4> *)&ray,v_01);
      w.n = 4;
      w.ptr = (float *)&ray;
      FVar13 = BilinearPDF((Point2f)local_188._0_8_,w);
      local_238 = local_238 * FVar13;
    }
  }
  return local_238;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, const Vector3f &wi) const {
        Float solidAngle = SolidAngle(ctx.p());
        // Return PDF based on uniform area sampling for challenging triangles
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Intersect sample ray with shape geometry
            Ray ray = ctx.SpawnRay(wi);
            pstd::optional<ShapeIntersection> isect = Intersect(ray);
            CHECK_RARE(1e-6, !isect.has_value());
            if (!isect)
                return 0;

            // Compute PDF in solid angle measure from shape intersection point
            Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
            if (IsInf(pdf))
                pdf = 0;

            return pdf;
        }

        Float pdf = 1 / solidAngle;
        // Adjust PDF for warp product sampling of triangle $\cos \theta$ factor
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Get triangle vertices in _p0_, _p1_, and _p2_
            const TriangleMesh *mesh = GetMesh();
            const int *v = &mesh->vertexIndices[3 * triIndex];
            Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

            Point2f u = InvertSphericalTriangleSample({p0, p1, p2}, ctx.p(), wi);
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            pdf *= BilinearPDF(u, w);
        }

        return pdf;
    }